

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

void vkt::tessellation::anon_unknown_0::TessCoordComponent::initPrograms
               (SourceCollections *programCollection,CaseDefinition caseDef)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  long lVar4;
  char *pcVar5;
  allocator<char> local_391;
  SourceCollections *local_390;
  undefined1 local_388 [40];
  string local_360;
  string local_340;
  ostringstream src;
  ostringstream src_2;
  string local_1a0 [368];
  
  local_390 = programCollection;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in  highp float in_v_attr;\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out highp float in_tc_attr;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    in_tc_attr = in_v_attr;\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_388,"vert",(allocator<char> *)&local_340);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&local_390->glslSources,(string *)local_388);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)&src_2,&local_360);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)&src_2);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_shader : require\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(vertices = 1) out;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp float in_tc_attr[];\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    gl_TessLevelInner[0] = in_tc_attr[0];\n");
  poVar2 = std::operator<<(poVar2,"    gl_TessLevelInner[1] = in_tc_attr[1];\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[0] = in_tc_attr[2];\n");
  poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[1] = in_tc_attr[3];\n");
  poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[2] = in_tc_attr[4];\n");
  poVar2 = std::operator<<(poVar2,"    gl_TessLevelOuter[3] = in_tc_attr[5];\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_388,"tesc",(allocator<char> *)&local_340);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&local_390->glslSources,(string *)local_388);
  std::__cxx11::stringbuf::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&src_2,&local_360);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)&src_2);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  if (caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD) {
    for (lVar4 = 0;
        (ulong)(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) * 8 + 0x10 != lVar4;
        lVar4 = lVar4 + 8) {
      poVar2 = std::operator<<((ostream *)&src,"    {\n");
      poVar2 = std::operator<<(poVar2,"        float oneMinusComp        = 1.0 - gl_TessCoord.");
      pcVar1 = *(char **)((long)&DAT_00c08ef0 + lVar4);
      poVar2 = std::operator<<(poVar2,pcVar1);
      poVar2 = std::operator<<(poVar2,";\n");
      poVar2 = std::operator<<(poVar2,"        sb_out.tessCoord[index].");
      poVar2 = std::operator<<(poVar2,pcVar1);
      poVar2 = std::operator<<(poVar2," = gl_TessCoord.");
      poVar2 = std::operator<<(poVar2,pcVar1);
      poVar2 = std::operator<<(poVar2," + oneMinusComp;\n");
      std::operator<<(poVar2,"    }\n");
    }
  }
  else {
    if (caseDef.caseType != CASETYPE_TESS_COORD_RANGE) goto LAB_0072c18f;
    std::operator<<((ostream *)&src,"    sb_out.tessCoord[index] = gl_TessCoord;\n");
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src_2);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)&src_2,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_tessellation_shader : require\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(");
  if ((ulong)caseDef.primitiveType < 3) {
    pcVar1 = (char *)(&DAT_00c09048)[caseDef.primitiveType];
  }
  else {
    pcVar1 = (char *)0x0;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,", ");
  if ((ulong)caseDef.spacingMode < 3) {
    pcVar1 = (&PTR_anon_var_dwarf_fe2586_00c09060)[caseDef.spacingMode];
  }
  else {
    pcVar1 = (char *)0x0;
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,", ");
  pcVar1 = (char *)0x0;
  if (caseDef.winding == WINDING_CW) {
    pcVar1 = "cw";
  }
  pcVar5 = "ccw";
  if (caseDef.winding != WINDING_CCW) {
    pcVar5 = pcVar1;
  }
  poVar2 = std::operator<<(poVar2,pcVar5);
  pcVar1 = "";
  if (caseDef.usePointMode != false) {
    pcVar1 = ", point_mode";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,") in;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
                          );
  poVar2 = std::operator<<(poVar2,"    int  numInvocations;\n");
  poVar2 = std::operator<<(poVar2,"    vec3 tessCoord[];\n");
  poVar2 = std::operator<<(poVar2,"} sb_out;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    int index = atomicAdd(sb_out.numInvocations, 1);\n");
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<(poVar2,(string *)local_388);
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"tese",&local_391);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_390->glslSources,&local_360);
  std::__cxx11::stringbuf::str();
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_388,&local_340);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_388);
  std::__cxx11::string::~string((string *)(local_388 + 8));
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src_2);
LAB_0072c18f:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void initPrograms (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp float in_v_attr;\n"
			<< "layout(location = 0) out highp float in_tc_attr;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_attr = in_v_attr;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = 1) out;\n"
			<< "\n"
			<< "layout(location = 0) in highp float in_tc_attr[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_TessLevelInner[0] = in_tc_attr[0];\n"
			<< "    gl_TessLevelInner[1] = in_tc_attr[1];\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = in_tc_attr[2];\n"
			<< "    gl_TessLevelOuter[1] = in_tc_attr[3];\n"
			<< "    gl_TessLevelOuter[2] = in_tc_attr[4];\n"
			<< "    gl_TessLevelOuter[3] = in_tc_attr[5];\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	{
		std::ostringstream tessCoordSrc;

		if (caseDef.caseType == CASETYPE_TESS_COORD_RANGE)
			tessCoordSrc << "    sb_out.tessCoord[index] = gl_TessCoord;\n";
		else if (caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD)
		{
			const char* components[]  = { "x" , "y", "z" };
			const int   numComponents = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

			for (int i = 0; i < numComponents; ++i)
				tessCoordSrc << "    {\n"
							 << "        float oneMinusComp        = 1.0 - gl_TessCoord." << components[i] << ";\n"
							 << "        sb_out.tessCoord[index]." << components[i] << " = gl_TessCoord." << components[i] << " + oneMinusComp;\n"
							 << "    }\n";
		}
		else
		{
			DE_ASSERT(false);
			return;
		}

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
						 << getSpacingModeShaderName(caseDef.spacingMode) << ", "
						 << getWindingShaderName(caseDef.winding)
						 << (caseDef.usePointMode ? ", point_mode" : "") << ") in;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
			<< "    int  numInvocations;\n"
			<< "    vec3 tessCoord[];\n"
			<< "} sb_out;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    int index = atomicAdd(sb_out.numInvocations, 1);\n"
			<< tessCoordSrc.str()
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}
}